

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpTestLog.c
# Opt level: O1

deBool qpTestLog_writeKernelSource(qpTestLog *log,char *source)

{
  deBool dVar1;
  char *elementContent;
  
  elementContent = "";
  if ((log->flags & 2) == 0) {
    elementContent = source;
  }
  deMutex_lock(log->lock);
  dVar1 = qpXmlWriter_writeStringElement(log->writer,"KernelSource",elementContent);
  if (dVar1 == 0) {
    qpPrintf("qpTestLog_writeKernelSource(): Writing XML failed\n");
  }
  deMutex_unlock(log->lock);
  return (uint)(dVar1 != 0);
}

Assistant:

deBool qpTestLog_writeKernelSource (qpTestLog* log, const char* source)
{
	const char*		sourceStr	= (log->flags & QP_TEST_LOG_EXCLUDE_SHADER_SOURCES) != 0 ? "" : source;

	DE_ASSERT(log);
	deMutex_lock(log->lock);

	if (!qpXmlWriter_writeStringElement(log->writer, "KernelSource", sourceStr))
	{
		qpPrintf("qpTestLog_writeKernelSource(): Writing XML failed\n");
		deMutex_unlock(log->lock);
		return DE_FALSE;
	}

	deMutex_unlock(log->lock);
	return DE_TRUE;
}